

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

bool isEmptyBlockBeforeTable(QTextBlock *block,QTextBlockFormat *format,Iterator *nextIt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextTable *pQVar4;
  iterator *in_RDX;
  QTextFormat *in_RSI;
  QTextBlock *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint uVar5;
  
  bVar1 = QTextFrame::iterator::atEnd(in_RDX);
  in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 & 0xffffff;
  uVar5 = in_stack_ffffffffffffffe4;
  if (!bVar1) {
    QTextFrame::iterator::currentFrame(in_RDX);
    pQVar4 = qobject_cast<QTextTable*>((QObject *)0x8007b0);
    uVar5 = 0;
    if (pQVar4 != (QTextTable *)0x0) {
      bVar1 = QTextBlock::isValid((QTextBlock *)
                                  (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                                  0xffffffffffffff));
      uVar5 = 0;
      if (bVar1) {
        iVar2 = QTextBlock::length(in_stack_ffffffffffffffd8);
        uVar5 = 0;
        if (iVar2 == 1) {
          bVar1 = QTextFormat::hasProperty(in_RSI,(int)((ulong)in_RDX >> 0x20));
          uVar5 = 0;
          if (!bVar1) {
            bVar1 = QTextFormat::hasProperty(in_RSI,(int)((ulong)in_RDX >> 0x20));
            uVar5 = 0;
            if (!bVar1) {
              QTextFrame::iterator::currentFrame(in_RDX);
              iVar2 = QTextFrame::firstPosition((QTextFrame *)in_stack_ffffffffffffffd8);
              iVar3 = QTextBlock::position(in_stack_ffffffffffffffd8);
              uVar5 = (uint)(iVar2 == iVar3 + 1) << 0x18;
            }
          }
        }
      }
    }
  }
  return SUB41(uVar5 >> 0x18,0);
}

Assistant:

static inline bool isEmptyBlockBeforeTable(const QTextBlock &block, const QTextBlockFormat &format, const QTextFrame::Iterator &nextIt)
{
    return !nextIt.atEnd()
           && qobject_cast<QTextTable *>(nextIt.currentFrame())
           && block.isValid()
           && block.length() == 1
           && !format.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth)
           && !format.hasProperty(QTextFormat::BackgroundBrush)
           && nextIt.currentFrame()->firstPosition() == block.position() + 1
           ;
}